

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::HandleTracePyCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  ulong uVar1;
  cmCTest *pcVar2;
  pointer piVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ostream *poVar7;
  mapped_type *this_00;
  int iVar8;
  int iVar9;
  cmCTestCoverageHandler *this_01;
  ulong uVar10;
  pointer fileName_00;
  string nl;
  string prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  _Base_ptr local_4c8 [4];
  string actualSourceFile;
  string fileName;
  string tempDir;
  string testingDir;
  string daGlob;
  ostringstream cmCTestLog_msg_4;
  undefined4 uStack_404;
  Glob gl;
  ostringstream cmCTestLog_msg;
  byte abStack_218 [488];
  
  cmsys::Glob::Glob(&gl);
  gl.Recurse = true;
  gl.RecurseThroughSymlinks = false;
  std::operator+(&daGlob,&cont->BinaryDir,"/*.cover");
  cmsys::Glob::FindFiles(&gl,&daGlob,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&files,__x);
  if (files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,
                             " Cannot find any Python Trace.py coverage files.");
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x680,(char *)CONCAT44(uStack_404,_cmCTestLog_msg_4),
                 (this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar9 = 0;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_
              ((string *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&testingDir,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"/Testing");
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::operator+(&tempDir,&testingDir,"/CoverageInfo");
    this_01 = (cmCTestCoverageHandler *)0x0;
    cmsys::SystemTools::MakeDirectory(&tempDir,(mode_t *)0x0);
    iVar9 = 0;
    for (fileName_00 = files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        fileName_00 !=
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; fileName_00 = fileName_00 + 1) {
      FindFile(&fileName,this_01,cont,fileName_00);
      if (fileName._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "Cannot find source Python file corresponding to: ");
        poVar7 = std::operator<<(poVar7,(string *)fileName_00);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        this_01 = (cmCTestCoverageHandler *)0x7;
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x68f,(char *)CONCAT44(uStack_404,_cmCTestLog_msg_4),false);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      else {
        cmsys::SystemTools::CollapseFullPath(&actualSourceFile,&fileName);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"   Check coverage for file: ");
        poVar7 = std::operator<<(poVar7,(string *)&actualSourceFile);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x697,(char *)CONCAT44(uStack_404,_cmCTestLog_msg_4),
                     (this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&cont->TotalCoverage,&actualSourceFile);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"   in file: ");
        poVar7 = std::operator<<(poVar7,(string *)fileName_00);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x69b,(char *)CONCAT44(uStack_404,_cmCTestLog_msg_4),
                     (this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::ifstream::ifstream
                  ((ostringstream *)&cmCTestLog_msg,(fileName_00->_M_dataplus)._M_p,_S_in);
        if ((abStack_218[*(long *)(_cmCTestLog_msg + -0x18)] & 5) == 0) {
          nl._M_dataplus._M_p = (pointer)&nl.field_2;
          nl._M_string_length = 0;
          nl.field_2._M_local_buf[0] = '\0';
          uVar1 = 0xffffffffffffffff;
          while( true ) {
            uVar10 = uVar1;
            this_01 = (cmCTestCoverageHandler *)&nl;
            bVar5 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)&cmCTestLog_msg,(string *)this_01,(bool *)0x0,-1);
            if (!bVar5) break;
            uVar1 = uVar10 + 1;
            if (0xb < nl._M_string_length) {
              std::__cxx11::string::substr((ulong)&prefix,(ulong)&nl);
              if ((prefix._M_dataplus._M_p[5] != ' ') && (prefix._M_dataplus._M_p[5] != ':')) {
                std::__cxx11::string::substr((ulong)&cmCTestLog_msg_4,(ulong)&nl);
                std::__cxx11::string::operator=((string *)&prefix,(string *)&cmCTestLog_msg_4);
                std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
                if ((prefix._M_dataplus._M_p[6] != ' ') && (prefix._M_dataplus._M_p[6] != ':')) {
                  std::__cxx11::string::substr((ulong)&cmCTestLog_msg_4,(ulong)&nl);
                  std::__cxx11::string::operator=((string *)&prefix,(string *)&cmCTestLog_msg_4);
                  std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
                  if ((prefix._M_dataplus._M_p[7] != ' ') && (prefix._M_dataplus._M_p[7] != ':')) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_4);
                    poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_4,
                                             "Currently the limit is maximum coverage of 999999");
                    std::endl<char,std::char_traits<char>>(poVar7);
                    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x6bb,(char *)local_4c8[0],false);
                    std::__cxx11::string::~string((string *)local_4c8);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_4);
                  }
                }
              }
              _Var4._M_p = prefix._M_dataplus._M_p;
              iVar6 = atoi(prefix._M_dataplus._M_p);
              if (_Var4._M_p[prefix._M_string_length - 1] != ':') {
                iVar6 = 0;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_4);
              poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_4,"Prefix: ");
              poVar7 = std::operator<<(poVar7,(string *)&prefix);
              poVar7 = std::operator<<(poVar7," cov: ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
              std::endl<char,std::char_traits<char>>(poVar7);
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,0,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x6c8,(char *)local_4c8[0],(this->super_cmCTestGenericHandler).Quiet);
              std::__cxx11::string::~string((string *)local_4c8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_4);
              while (piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start,
                    (ulong)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar1) {
                _cmCTestLog_msg_4 = 0xffffffff;
                std::vector<int,_std::allocator<int>_>::emplace_back<int>
                          (this_00,(int *)&cmCTestLog_msg_4);
              }
              iVar8 = piVar3[uVar10 + 1];
              if ((iVar8 < 0) && (-1 < iVar6)) {
                piVar3[uVar10 + 1] = 0;
                iVar8 = 0;
              }
              piVar3[uVar10 + 1] = iVar8 + iVar6;
              std::__cxx11::string::~string((string *)&prefix);
            }
          }
          std::__cxx11::string::~string((string *)&nl);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_4);
          poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_4,"Cannot open file: ");
          poVar7 = std::operator<<(poVar7,(string *)fileName_00);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          this_01 = (cmCTestCoverageHandler *)0x7;
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x69f,nl._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&nl);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_4);
        }
        iVar9 = iVar9 + 1;
        std::ifstream::~ifstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&actualSourceFile);
      }
      std::__cxx11::string::~string((string *)&fileName);
    }
    std::__cxx11::string::~string((string *)&tempDir);
    std::__cxx11::string::~string((string *)&testingDir);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  std::__cxx11::string::~string((string *)&daGlob);
  cmsys::Glob::~Glob(&gl);
  return iVar9;
}

Assistant:

int cmCTestCoverageHandler::HandleTracePyCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmsys::Glob gl;
  gl.RecurseOn();
  gl.RecurseThroughSymlinksOff();
  std::string daGlob = cont->BinaryDir + "/*.cover";
  gl.FindFiles(daGlob);
  std::vector<std::string> files = gl.GetFiles();

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any Python Trace.py coverage files."
                         << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }

  std::string testingDir = this->CTest->GetBinaryDir() + "/Testing";
  std::string tempDir = testingDir + "/CoverageInfo";
  cmSystemTools::MakeDirectory(tempDir);

  int file_count = 0;
  for (std::string const& file : files) {
    std::string fileName = this->FindFile(cont, file);
    if (fileName.empty()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot find source Python file corresponding to: "
                   << file << std::endl);
      continue;
    }

    std::string actualSourceFile = cmSystemTools::CollapseFullPath(fileName);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   Check coverage for file: " << actualSourceFile
                                                      << std::endl,
                       this->Quiet);
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector* vec =
      &cont->TotalCoverage[actualSourceFile];
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   in file: " << file << std::endl, this->Quiet);
    cmsys::ifstream ifile(file.c_str());
    if (!ifile) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open file: " << file << std::endl);
    } else {
      long cnt = -1;
      std::string nl;
      while (cmSystemTools::GetLineFromStream(ifile, nl)) {
        cnt++;

        // Skip empty lines
        if (nl.empty()) {
          continue;
        }

        // Skip unused lines
        if (nl.size() < 12) {
          continue;
        }

        // Read the coverage count from the beginning of the Trace.py output
        // line
        std::string prefix = nl.substr(0, 6);
        if (prefix[5] != ' ' && prefix[5] != ':') {
          // This is a hack. We should really do something more elaborate
          prefix = nl.substr(0, 7);
          if (prefix[6] != ' ' && prefix[6] != ':') {
            prefix = nl.substr(0, 8);
            if (prefix[7] != ' ' && prefix[7] != ':') {
              cmCTestLog(this->CTest, ERROR_MESSAGE,
                         "Currently the limit is maximum coverage of 999999"
                           << std::endl);
            }
          }
        }
        int cov = atoi(prefix.c_str());
        if (prefix[prefix.size() - 1] != ':') {
          // This line does not have ':' so no coverage here. That said,
          // Trace.py does not handle not covered lines versus comments etc.
          // So, this will be set to 0.
          cov = 0;
        }
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "Prefix: " << prefix << " cov: " << cov << std::endl, this->Quiet);
        // Read the line number starting at the 10th character of the gcov
        // output line
        long lineIdx = cnt;
        if (lineIdx >= 0) {
          while (vec->size() <= static_cast<size_t>(lineIdx)) {
            vec->push_back(-1);
          }
          // Initially all entries are -1 (not used). If we get coverage
          // information, increment it to 0 first.
          if ((*vec)[lineIdx] < 0) {
            if (cov >= 0) {
              (*vec)[lineIdx] = 0;
            }
          }
          (*vec)[lineIdx] += cov;
        }
      }
    }
    ++file_count;
  }
  return file_count;
}